

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int * __thiscall Image::histogram(Image *this)

{
  int *piVar1;
  int local_24;
  int local_20;
  int j;
  int i_1;
  int i;
  int *h;
  Image *this_local;
  
  piVar1 = (int *)operator_new__(0x400);
  for (j = 0; j < 0x100; j = j + 1) {
    piVar1[j] = 0;
  }
  for (local_20 = 0; local_20 < this->row; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < this->col; local_24 = local_24 + 1) {
      piVar1[this->matrix[local_20][local_24]] = piVar1[this->matrix[local_20][local_24]] + 1;
    }
  }
  return piVar1;
}

Assistant:

int *Image::histogram()
{
    auto h = new int[256];

    for(int i=0; i<=255; ++i)
        h[i] = 0;
    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            h[matrix[i][j]]++;
        }
    }
    return h;
}